

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.h
# Opt level: O2

void __thiscall TadsMessageQueue::TadsMessageQueue(TadsMessageQueue *this,OS_Event *quit_evt)

{
  OS_Counter *pOVar1;
  OS_Mutex *this_00;
  OS_Event *this_01;
  
  (this->super_CVmRefCntObj).cnt.cnt.super___atomic_base<long>._M_i = 1;
  (this->super_CVmRefCntObj)._vptr_CVmRefCntObj = (_func_int **)&PTR__TadsMessageQueue_003431a8;
  this_00 = (OS_Mutex *)operator_new(0x38);
  OS_Mutex::OS_Mutex(this_00);
  this->mu = this_00;
  this_01 = (OS_Event *)operator_new(0x88);
  OS_Event::OS_Event(this_01,0);
  this->ev = this_01;
  this->head = (TadsMessage *)0x0;
  this->tail = (TadsMessage *)0x0;
  this->quit_evt = quit_evt;
  if (quit_evt != (OS_Event *)0x0) {
    LOCK();
    pOVar1 = &(quit_evt->super_CVmRefCntObj).cnt;
    (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + 1;
    UNLOCK();
  }
  return;
}

Assistant:

TadsMessageQueue(OS_Event *quit_evt)
    {
        /* create our mutex object */
        mu = new OS_Mutex();

        /* create our event - this signals when a message arrives */
        ev = new OS_Event(FALSE);

        /* no messages in the queue yet */
        head = tail = 0;

        /* remember my global quit event */
        if ((this->quit_evt = quit_evt) != 0)
            quit_evt->add_ref();
    }